

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant
          (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *this)

{
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  runtime_error *this_00;
  size_t sVar4;
  size_t j;
  size_t sVar5;
  long lVar6;
  
  sVar1 = (this->geometry_).dimension_;
  if (sVar1 == 0) {
    if ((this->geometry_).isSimple_ == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      if (this->data_ == (pointer)0x0) {
        return;
      }
      if ((this->geometry_).size_ == 1) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  else if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    sVar4 = 1;
    sVar5 = 0;
    do {
      sVar4 = sVar4 * (this->geometry_).shape_[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
    if ((this->geometry_).size_ == sVar4) {
      psVar2 = (this->geometry_).shape_;
      psVar3 = (this->geometry_).shapeStrides_;
      sVar5 = 1;
      sVar4 = sVar1;
      if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
        do {
          if (psVar3[sVar4 - 1] != sVar5) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0010792f;
          }
          sVar5 = sVar5 * psVar2[sVar4 - 1];
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      else {
        sVar4 = 0;
        do {
          if (psVar3[sVar4] != sVar5) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0010792f;
          }
          sVar5 = sVar5 * psVar2[sVar4];
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      if ((this->geometry_).isSimple_ == true) {
        lVar6 = 0;
        do {
          if ((this->geometry_).strides_[lVar6] != (this->geometry_).shapeStrides_[lVar6]) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0010792f;
          }
          lVar6 = lVar6 + 1;
        } while (sVar1 + (sVar1 == 0) != lVar6);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_0010792f:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline const std::size_t 
Geometry<A>::dimension() const
{
    return dimension_; 
}